

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

int lua_gettable(lua_State *L,int idx)

{
  byte tag;
  TValue *t;
  byte bVar1;
  TValue *pTVar2;
  
  t = index2value(L,idx);
  tag = 0x30;
  if (t->tt_ == 'E') {
    pTVar2 = (TValue *)((L->top).offset + -0x10);
    tag = luaH_get((Table *)(t->value_).gc,pTVar2,pTVar2);
    bVar1 = tag & 0xf;
    if (bVar1 != 0) goto LAB_00106921;
  }
  pTVar2 = (TValue *)((L->top).offset + -0x10);
  bVar1 = luaV_finishget(L,t,pTVar2,(StkId)pTVar2,tag);
  bVar1 = bVar1 & 0xf;
LAB_00106921:
  return (int)bVar1;
}

Assistant:

LUA_API int lua_gettable (lua_State *L, int idx) {
  lu_byte tag;
  TValue *t;
  lua_lock(L);
  api_checkpop(L, 1);
  t = index2value(L, idx);
  luaV_fastget(t, s2v(L->top.p - 1), s2v(L->top.p - 1), luaH_get, tag);
  if (tagisempty(tag))
    tag = luaV_finishget(L, t, s2v(L->top.p - 1), L->top.p - 1, tag);
  lua_unlock(L);
  return novariant(tag);
}